

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

void __thiscall
kj::_::AdapterPromiseNode<kj::_::Void,_kj::(anonymous_namespace)::WebSocketPipeImpl::BlockedPumpTo>
::destroy(AdapterPromiseNode<kj::_::Void,_kj::(anonymous_namespace)::WebSocketPipeImpl::BlockedPumpTo>
          *this)

{
  AdapterPromiseNode<kj::_::Void,_kj::(anonymous_namespace)::WebSocketPipeImpl::BlockedPumpTo>
  *this_local;
  
  freePromise<kj::_::AdapterPromiseNode<kj::_::Void,kj::(anonymous_namespace)::WebSocketPipeImpl::BlockedPumpTo>>
            (this);
  return;
}

Assistant:

void destroy() override { freePromise(this); }